

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O1

Vec_Wec_t * Cmd_ReadParamChoices(char *pConfig)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  FILE *__stream;
  Vec_Wec_t *pVVar5;
  Vec_Int_t *pVVar6;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  byte *pbVar12;
  byte *__nptr;
  bool bVar13;
  double dVar14;
  char pBuffer [1000];
  undefined8 local_420;
  byte local_418 [1000];
  
  __stream = fopen(pConfig,"rb");
  if (__stream == (FILE *)0x0) {
    pcVar7 = "File containing list of files \"%s\" cannot be opened.\n";
LAB_00323291:
    printf(pcVar7,pConfig);
LAB_00323298:
    pVVar5 = (Vec_Wec_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Wec_t *)malloc(0x10);
    pVVar5->nCap = 100;
    pVVar5->nSize = 0;
    pVVar6 = (Vec_Int_t *)calloc(100,0x10);
    pVVar5->pArray = pVVar6;
    pcVar7 = fgets((char *)local_418,1000,__stream);
    while (pcVar7 != (char *)0x0) {
      if ((local_418[0] != 0x23) &&
         ((local_418[0] < 0x21 & (byte)(0x100002600 >> (local_418[0] & 0x3f))) == 0)) {
        while( true ) {
          sVar8 = strlen((char *)local_418);
          uVar9 = (ulong)local_418[sVar8 - 1];
          if ((0x20 < uVar9) || ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0)) break;
          local_418[sVar8 - 1] = 0;
        }
        uVar2 = pVVar5->nCap;
        uVar3 = pVVar5->nSize;
        if (uVar3 == uVar2) {
          lVar10 = (long)(int)uVar2;
          if ((int)uVar2 < 0x10) {
            if (pVVar5->pArray == (Vec_Int_t *)0x0) {
              pVVar6 = (Vec_Int_t *)malloc(0x100);
            }
            else {
              pVVar6 = (Vec_Int_t *)realloc(pVVar5->pArray,0x100);
            }
            pVVar5->pArray = pVVar6;
            memset(pVVar6 + lVar10,0,(0x10 - lVar10) * 0x10);
            iVar11 = 0x10;
          }
          else {
            iVar11 = uVar2 * 2;
            if (iVar11 <= (int)uVar2) goto LAB_00323110;
            if (pVVar5->pArray == (Vec_Int_t *)0x0) {
              pVVar6 = (Vec_Int_t *)malloc((ulong)uVar2 << 5);
            }
            else {
              pVVar6 = (Vec_Int_t *)realloc(pVVar5->pArray,(ulong)uVar2 << 5);
            }
            pVVar5->pArray = pVVar6;
            memset(pVVar6 + lVar10,0,lVar10 * 0x10);
          }
          pVVar5->nCap = iVar11;
        }
LAB_00323110:
        pVVar5->nSize = uVar3 + 1;
        if ((int)uVar3 < 0) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
        }
        if (local_418[0] != 0) {
          local_420 = pVVar5->pArray + ((ulong)(uVar3 + 1) - 1);
          pbVar12 = local_418;
          bVar4 = local_418[0];
          do {
            pVVar6 = local_420;
            if ((byte)(bVar4 + 0x85) < 0xe6) {
              if ((byte)(bVar4 + 0xa5) < 0xe6) {
                pcVar7 = "Expecting a leading lower-case or upper-case digit in line \"%s\".\n";
                pConfig = (char *)local_418;
                goto LAB_00323291;
              }
              __nptr = pbVar12 + 1;
              bVar1 = pbVar12[1];
              bVar13 = (byte)(bVar1 - 0x3a) < 0xf6;
              if (bVar1 != 0x2e && bVar13) {
                printf("Upper-case character (%c) should be followed by a number without space in line \"%s\".\n"
                       ,(ulong)bVar4,local_418);
              }
              else {
                dVar14 = atof((char *)__nptr);
                pVVar6 = local_420;
                Vec_IntPush(local_420,(uint)bVar4);
                Vec_IntPush(pVVar6,(int)(float)dVar14);
                __nptr = pbVar12;
                do {
                  pbVar12 = __nptr + 1;
                  __nptr = __nptr + 1;
                } while (*pbVar12 == 0x2e || 0xf5 < (byte)(*pbVar12 - 0x3a));
                while (((ulong)*__nptr < 0x21 &&
                       ((0x100002600U >> ((ulong)*__nptr & 0x3f) & 1) != 0))) {
                  __nptr = __nptr + 1;
                }
              }
              if (bVar1 != 0x2e && bVar13) goto LAB_00323298;
            }
            else {
              Vec_IntPush(local_420,(uint)bVar4);
              Vec_IntPush(pVVar6,-0x40800000);
              __nptr = pbVar12;
              do {
                __nptr = __nptr + 1;
                if (0x20 < (ulong)*__nptr) break;
              } while ((0x100002600U >> ((ulong)*__nptr & 0x3f) & 1) != 0);
            }
            bVar4 = *__nptr;
            pbVar12 = __nptr;
          } while (bVar4 != 0);
        }
      }
      pcVar7 = fgets((char *)local_418,1000,__stream);
    }
    fclose(__stream);
  }
  return pVVar5;
}

Assistant:

Vec_Wec_t * Cmd_ReadParamChoices( char * pConfig )
{
    Vec_Wec_t * vPars;
    Vec_Int_t * vLine;
    char * pThis, pBuffer[CMD_AUTO_LINE_MAX];
    FILE * pFile = fopen( pConfig, "rb" );
    if ( pFile == NULL )
        { printf( "File containing list of files \"%s\" cannot be opened.\n", pConfig ); return NULL; }
    vPars = Vec_WecAlloc( 100 );
    while ( fgets( pBuffer, CMD_AUTO_LINE_MAX, pFile ) != NULL )
    {
        // get the command from the file
        if ( Cmf_IsSpace(pBuffer[0]) || pBuffer[0] == '#')
            continue;
        // skip trailing spaces
        while ( Cmf_IsSpace(pBuffer[strlen(pBuffer)-1]) )
            pBuffer[strlen(pBuffer)-1] = 0;
        // read the line
        vLine = Vec_WecPushLevel( vPars );
        for ( pThis = pBuffer; *pThis;  )
        {
            if ( Cmf_IsLowerCaseChar(*pThis) )
            {
                Vec_IntPushTwo( vLine, (int)*pThis, Abc_Float2Int((float)-1.0) );
                pThis++;
                while ( Cmf_IsSpace(*pThis) )
                    pThis++;
                continue;
            }
            if ( Cmf_IsUpperCaseChar(*pThis) )
            {
                char Param = *pThis++;
                if ( !Cmf_IsDigit(*pThis) )
                    { printf( "Upper-case character (%c) should be followed by a number without space in line \"%s\".\n", Param, pBuffer ); return NULL; }
                Vec_IntPushTwo( vLine, (int)Param, Abc_Float2Int(atof(pThis)) );
                while ( Cmf_IsDigit(*pThis) )
                    pThis++;
                while ( Cmf_IsSpace(*pThis) )
                    pThis++;
                continue;
            }
            printf( "Expecting a leading lower-case or upper-case digit in line \"%s\".\n", pBuffer ); 
            return NULL;
        }
    }
    fclose( pFile );
    return vPars;
}